

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.hpp
# Opt level: O2

int32_t __thiscall Script::add_or_find_model(Script *this,string_view *name)

{
  const_iterator __position;
  int *piVar1;
  iterator iVar2;
  int32_t iVar3;
  allocator<char> local_51;
  optional<int32_t> opt;
  unsigned_long local_30;
  
  find_model((Script *)&opt,(string_view *)this);
  if (opt.super_OptionalBase<int>.init_ == true) {
    piVar1 = std::experimental::optional<int>::operator*(&opt);
    iVar3 = *piVar1;
  }
  else {
    __position._M_current =
         (this->models).
         super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    libcxx_strviewclone::basic_string_view<char,std::char_traits<char>>::
    to_string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,name,
               &local_51);
    local_30 = ((long)(this->models).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->models).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28;
    iVar2 = std::
            vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
            ::_M_emplace_aux<std::__cxx11::string,unsigned_long>
                      ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                        *)&this->models,__position,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&opt,
                       &local_30);
    iVar3 = (iVar2._M_current)->second;
    std::__cxx11::string::~string((string *)&opt);
  }
  return iVar3;
}

Assistant:

int32_t add_or_find_model(const string_view& name)
    {
        if(auto opt = this->find_model(name))
            return *opt;
        return this->models.emplace(models.end(), name.to_string(), models.size())->second;
    }